

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::UnsafeArenaAddAllocatedMessage
          (Reflection *this,Message *message,FieldDescriptor *field,Message *new_entry)

{
  bool bVar1;
  uint32_t uVar2;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *this_01;
  char *description;
  Descriptor *pDVar3;
  Metadata MVar4;
  
  MVar4 = Message::GetMetadata(message);
  if (MVar4.reflection != this) {
    pDVar3 = this->descriptor_;
    MVar4 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar3,MVar4.descriptor,field,"UnsafeArenaAddAllocatedMessage");
  }
  pDVar3 = this->descriptor_;
  if (field->containing_type_ == pDVar3) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"UnsafeArenaAddAllocatedMessage",CPPTYPE_MESSAGE);
      }
      if ((field->field_0x1 & 8) == 0) {
        bVar1 = FieldDescriptor::is_map(field);
        if (bVar1) {
          this_00 = MutableRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
          this_01 = internal::MapFieldBase::MutableRepeatedField(this_00);
        }
        else {
          this_01 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field)
          ;
        }
        internal::RepeatedPtrFieldBase::
        UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                  (this_01,new_entry);
        return;
      }
      uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
      internal::ExtensionSet::UnsafeArenaAddAllocatedMessage
                ((ExtensionSet *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),field,
                 &new_entry->super_MessageLite);
      return;
    }
    pDVar3 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError
            (pDVar3,field,"UnsafeArenaAddAllocatedMessage",description);
}

Assistant:

void Reflection::UnsafeArenaAddAllocatedMessage(Message* message,
                                                const FieldDescriptor* field,
                                                Message* new_entry) const {
  USAGE_MUTABLE_CHECK_ALL(UnsafeArenaAddAllocatedMessage, REPEATED, MESSAGE);

  if (field->is_extension()) {
    MutableExtensionSet(message)->UnsafeArenaAddAllocatedMessage(field,
                                                                 new_entry);
  } else {
    RepeatedPtrFieldBase* repeated = nullptr;
    if (IsMapFieldInApi(field)) {
      repeated =
          MutableRaw<MapFieldBase>(message, field)->MutableRepeatedField();
    } else {
      repeated = MutableRaw<RepeatedPtrFieldBase>(message, field);
    }
    repeated->UnsafeArenaAddAllocated<GenericTypeHandler<Message>>(new_entry);
  }
}